

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::dotSI8x16toI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *val;
  uint8_t *puVar1;
  long lVar2;
  uint8_t *puVar3;
  Type *this_00;
  uintptr_t uVar4;
  undefined1 local_418 [8];
  LaneArray<8UL_*_2UL> lhs;
  LaneArray<8UL_*_2UL> rhs;
  LaneArray<8UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  
  getLanes<signed_char,16>((LaneArray<16> *)local_418,(wasm *)this,other);
  getLanes<signed_char,16>((LaneArray<16> *)&lhs._M_elems[0xf].type,(wasm *)other,val);
  uVar4 = 0;
  memset(&rhs._M_elems[0xf].type,0,0xc0);
  puVar3 = rhs._M_elems[0].field_0.v128 + 8;
  puVar1 = lhs._M_elems[0].field_0.v128 + 8;
  do {
    local_48.i32 = 0;
    local_38 = 2;
    this_00 = &result._M_elems[uVar4 - 1].type;
    result._M_elems[7].type.id = uVar4;
    if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_48) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,(Literal *)&local_48.func);
    }
    ~Literal((Literal *)&local_48.func);
    lVar2 = 0;
    do {
      if (((result._M_elems[uVar4].field_0.func.super_IString.str._M_str != (char *)0x2) ||
          (*(long *)(puVar1 + lVar2) != 2)) || (*(long *)(puVar3 + lVar2) != 2)) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      local_48.i32 = *(int *)(puVar3 + lVar2 + -0x10) * *(int *)(puVar1 + lVar2 + -0x10) +
                     (int)this_00->id;
      local_38 = 2;
      if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_48) {
        ~Literal((Literal *)this_00);
        Literal((Literal *)this_00,(Literal *)&local_48.func);
      }
      ~Literal((Literal *)&local_48.func);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 == 0x18);
    uVar4 = result._M_elems[7].type.id + 1;
    puVar3 = puVar3 + 0x30;
    puVar1 = puVar1 + 0x30;
    if (uVar4 == 8) {
      Literal(__return_storage_ptr__,(LaneArray<8> *)&rhs._M_elems[0xf].type);
      lVar2 = 0xa8;
      do {
        ~Literal((Literal *)((long)result._M_elems + lVar2 + -8));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      lVar2 = 0x168;
      do {
        ~Literal((Literal *)((long)rhs._M_elems + lVar2 + -8));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      lVar2 = 0x168;
      do {
        ~Literal((Literal *)(local_418 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Literal Literal::dotSI8x16toI16x8(const Literal& other) const {
  return dot<8, 2, &Literal::getLanesSI8x16>(*this, other);
}